

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_variable.cpp
# Opt level: O3

adios2_error
adios2_set_operation_parameter(adios2_variable *variable,size_t operation_id,char *key,char *value)

{
  allocator local_a9;
  allocator local_a8 [32];
  string local_88;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"for adios2_variable, in call to adios2_set_operation_parameter",""
            );
  adios2::helper::CheckForNullptr<adios2_variable>(variable,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::__cxx11::string::string((string *)local_48,key,local_a8);
  std::__cxx11::string::string((string *)local_68,value,&local_a9);
  adios2::core::VariableBase::SetOperationParameter(variable,operation_id,local_48,local_68);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return adios2_error_none;
}

Assistant:

adios2_error adios2_set_operation_parameter(adios2_variable *variable, const size_t operation_id,
                                            const char *key, const char *value)
{
    try
    {
        adios2::helper::CheckForNullptr(variable, "for adios2_variable, in call to "
                                                  "adios2_set_operation_parameter");

        adios2::core::VariableBase *variableBase =
            reinterpret_cast<adios2::core::VariableBase *>(variable);
        variableBase->SetOperationParameter(operation_id, key, value);
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_set_operation_parameter"));
    }
}